

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::Postprocess_BuildShape
          (X3DImporter *this,CX3DImporter_NodeElement_Shape *pShapeNodeElement,
          list<unsigned_int,_std::allocator<unsigned_int>_> *pNodeMeshInd,
          list<aiMesh_*,_std::allocator<aiMesh_*>_> *pSceneMeshList,
          list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pSceneMaterialList)

{
  list<aiMesh_*,_std::allocator<aiMesh_*>_> *this_00;
  bool bVar1;
  uint uVar2;
  reference ppCVar3;
  size_type sVar4;
  undefined1 local_6c [8];
  aiVector3D tvec3;
  int32_t tm;
  _Self local_50;
  const_iterator it;
  uint mat_ind;
  EType mesh_type;
  aiMesh *tmesh;
  aiMaterial *tmat;
  list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *pSceneMaterialList_local;
  list<aiMesh_*,_std::allocator<aiMesh_*>_> *pSceneMeshList_local;
  list<unsigned_int,_std::allocator<unsigned_int>_> *pNodeMeshInd_local;
  CX3DImporter_NodeElement_Shape *pShapeNodeElement_local;
  X3DImporter *this_local;
  
  tmesh = (aiMesh *)0x0;
  _mat_ind = (aiMesh *)0x0;
  it._M_node._4_4_ = ENET_Invalid;
  it._M_node._0_4_ = 0;
  tmat = (aiMaterial *)pSceneMaterialList;
  pSceneMaterialList_local = (list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)pSceneMeshList;
  pSceneMeshList_local = (list<aiMesh_*,_std::allocator<aiMesh_*>_> *)pNodeMeshInd;
  pNodeMeshInd_local = (list<unsigned_int,_std::allocator<unsigned_int>_> *)pShapeNodeElement;
  pShapeNodeElement_local = (CX3DImporter_NodeElement_Shape *)this;
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
       begin(&(pShapeNodeElement->super_CX3DImporter_NodeElement).Child);
  while( true ) {
    _tm = std::__cxx11::
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                    ((list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                      *)&pNodeMeshInd_local[2].
                         super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         _M_node.super__List_node_base._M_prev);
    bVar1 = std::operator!=(&local_50,(_Self *)&tm);
    if (!bVar1) break;
    ppCVar3 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_50);
    bVar1 = PostprocessHelper_ElementIsMesh(this,(*ppCVar3)->Type);
    if (bVar1) {
      ppCVar3 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_50);
      Postprocess_BuildMesh(this,*ppCVar3,(aiMesh **)&mat_ind);
      this_00 = pSceneMeshList_local;
      if (_mat_ind != (aiMesh *)0x0) {
        sVar4 = std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                          ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)pSceneMaterialList_local);
        tvec3.z = (float)sVar4;
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((list<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                   (value_type_conflict *)&tvec3.z);
        std::__cxx11::list<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((list<aiMesh_*,_std::allocator<aiMesh_*>_> *)pSceneMaterialList_local,
                   (value_type *)&mat_ind);
        ppCVar3 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_50);
        it._M_node._4_4_ = (*ppCVar3)->Type;
      }
    }
    else {
      ppCVar3 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_50);
      if ((*ppCVar3)->Type == ENET_Appearance) {
        ppCVar3 = std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator*(&local_50);
        Postprocess_BuildMaterial(this,*ppCVar3,(aiMaterial **)&tmesh);
        if (tmesh != (aiMesh *)0x0) {
          sVar4 = std::__cxx11::list<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                            ((list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)tmat);
          it._M_node._0_4_ = (uint)sVar4;
          std::__cxx11::list<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back
                    ((list<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)tmat,(value_type *)&tmesh)
          ;
        }
      }
    }
    std::_List_const_iterator<CX3DImporter_NodeElement_*>::operator++(&local_50);
  }
  if ((_mat_ind != (aiMesh *)0x0) && (tmesh != (aiMesh *)0x0)) {
    _mat_ind->mMaterialIndex = (uint)it._M_node;
    uVar2 = aiMaterial::GetTextureCount((aiMaterial *)tmesh,aiTextureType_DIFFUSE);
    if ((uVar2 != 0) && (bVar1 = aiMesh::HasTextureCoords(_mat_ind,0), !bVar1)) {
      aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_6c);
      if (it._M_node._4_4_ == ENET_Box) {
        tvec3.y = 4.2039e-45;
      }
      else if (it._M_node._4_4_ - ENET_Cone < 2) {
        tvec3.y = 2.8026e-45;
      }
      else if (it._M_node._4_4_ == ENET_Sphere) {
        tvec3.y = 1.4013e-45;
      }
      else {
        tvec3.y = 5.60519e-45;
      }
      aiMaterial::AddProperty((aiMaterial *)tmesh,(int *)&tvec3.y,1,"$tex.mapping",1,0);
    }
  }
  return;
}

Assistant:

void X3DImporter::Postprocess_BuildShape(const CX3DImporter_NodeElement_Shape& pShapeNodeElement, std::list<unsigned int>& pNodeMeshInd,
							std::list<aiMesh*>& pSceneMeshList, std::list<aiMaterial*>& pSceneMaterialList) const
{
    aiMaterial* tmat = nullptr;
    aiMesh* tmesh = nullptr;
    CX3DImporter_NodeElement::EType mesh_type = CX3DImporter_NodeElement::ENET_Invalid;
    unsigned int mat_ind = 0;

	for(std::list<CX3DImporter_NodeElement*>::const_iterator it = pShapeNodeElement.Child.begin(); it != pShapeNodeElement.Child.end(); ++it)
	{
		if(PostprocessHelper_ElementIsMesh((*it)->Type))
		{
			Postprocess_BuildMesh(**it, &tmesh);
			if(tmesh != nullptr)
			{
				// if mesh successfully built then add data about it to arrays
				pNodeMeshInd.push_back(static_cast<unsigned int>(pSceneMeshList.size()));
				pSceneMeshList.push_back(tmesh);
				// keep mesh type. Need above for texture coordinate generation.
				mesh_type = (*it)->Type;
			}
		}
		else if((*it)->Type == CX3DImporter_NodeElement::ENET_Appearance)
		{
			Postprocess_BuildMaterial(**it, &tmat);
			if(tmat != nullptr)
			{
				// if material successfully built then add data about it to array
				mat_ind = static_cast<unsigned int>(pSceneMaterialList.size());
				pSceneMaterialList.push_back(tmat);
			}
		}
	}// for(std::list<CX3DImporter_NodeElement*>::const_iterator it = pShapeNodeElement.Child.begin(); it != pShapeNodeElement.Child.end(); it++)

	// associate read material with read mesh.
	if((tmesh != nullptr) && (tmat != nullptr))
	{
		tmesh->mMaterialIndex = mat_ind;
		// Check texture mapping. If material has texture but mesh has no texture coordinate then try to ask Assimp to generate texture coordinates.
		if((tmat->GetTextureCount(aiTextureType_DIFFUSE) != 0) && !tmesh->HasTextureCoords(0))
		{
			int32_t tm;
			aiVector3D tvec3;

			switch(mesh_type)
			{
				case CX3DImporter_NodeElement::ENET_Box:
					tm = aiTextureMapping_BOX;
					break;
				case CX3DImporter_NodeElement::ENET_Cone:
				case CX3DImporter_NodeElement::ENET_Cylinder:
					tm = aiTextureMapping_CYLINDER;
					break;
				case CX3DImporter_NodeElement::ENET_Sphere:
					tm = aiTextureMapping_SPHERE;
					break;
				default:
					tm = aiTextureMapping_PLANE;
					break;
			}// switch(mesh_type)

			tmat->AddProperty(&tm, 1, AI_MATKEY_MAPPING_DIFFUSE(0));
		}// if((tmat->GetTextureCount(aiTextureType_DIFFUSE) != 0) && !tmesh->HasTextureCoords(0))
	}// if((tmesh != nullptr) && (tmat != nullptr))
}